

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FILongValue> __thiscall
Assimp::FILongValue::create(FILongValue *this,vector<long,_std::allocator<long>_> *value)

{
  pointer plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer plVar2;
  shared_ptr<Assimp::FILongValue> sVar3;
  
  plVar2 = (pointer)operator_new(0x58);
  plVar2[1] = 0x100000001;
  *plVar2 = (long)&PTR___Sp_counted_ptr_inplace_00938ae0;
  plVar2[2] = (long)&PTR_toString_abi_cxx11__00938b30;
  plVar2[6] = (long)(plVar2 + 8);
  plVar2[7] = 0;
  *(undefined1 *)(plVar2 + 8) = 0;
  *(undefined1 *)(plVar2 + 10) = 0;
  plVar1 = (value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2[3] = (long)(value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  plVar2[4] = (long)plVar1;
  plVar2[5] = (long)(value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (value->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(plVar2 + 2);
  (this->value).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = plVar2;
  sVar3.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar3.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FILongValue>)
         sVar3.super___shared_ptr<Assimp::FILongValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FILongValue> FILongValue::create(std::vector<int64_t> &&value) {
    return std::make_shared<FILongValueImpl>(std::move(value));
}